

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# formatter.cpp
# Opt level: O1

Error asmjit::v1_14::Formatter::formatFeature(String *sb,Arch arch,uint32_t featureId)

{
  Error EVar1;
  
  if ((byte)(arch - k32BitMask) < 2) {
    EVar1 = x86::FormatterInternal::formatFeature(sb,featureId);
    return EVar1;
  }
  if ((arch < (kAArch64_BE|kHost)) && ((0x38e0U >> (arch & 0x1f) & 1) != 0)) {
    EVar1 = arm::FormatterInternal::formatFeature(sb,featureId);
    return EVar1;
  }
  return 4;
}

Assistant:

Error formatFeature(
  String& sb,
  Arch arch,
  uint32_t featureId) noexcept {

#if !defined(ASMJIT_NO_X86)
  if (Environment::isFamilyX86(arch))
    return x86::FormatterInternal::formatFeature(sb, featureId);
#endif

#if !defined(ASMJIT_NO_AARCH64)
  if (Environment::isFamilyARM(arch))
    return arm::FormatterInternal::formatFeature(sb, featureId);
#endif

  return kErrorInvalidArch;
}